

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O3

void __thiscall slang::ast::Scope::reportNameConflict(Scope *this,Symbol *member,Symbol *existing)

{
  bool bVar1;
  Type *this_00;
  Type *this_01;
  Type *pTVar2;
  Diagnostic *this_02;
  Diagnostic *pDVar3;
  
  bVar1 = Symbol::isValue(existing);
  if (bVar1) {
    bVar1 = Symbol::isValue(member);
    if (bVar1) {
      this_00 = DeclaredType::getType((DeclaredType *)(member + 1));
      this_01 = DeclaredType::getType((DeclaredType *)(existing + 1));
      pTVar2 = this_00->canonical;
      if (pTVar2 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar2 = this_00->canonical;
      }
      if ((pTVar2->super_Symbol).kind != ErrorType) {
        pTVar2 = this_01->canonical;
        if (pTVar2 == (Type *)0x0) {
          Type::resolveCanonical(this_01);
          pTVar2 = this_01->canonical;
        }
        if ((pTVar2->super_Symbol).kind != ErrorType) {
          bVar1 = Type::isMatching(this_00,this_01);
          if (!bVar1) {
            this_02 = addDiag(this,(DiagCode)0x2b000a,member->location);
            pDVar3 = Diagnostic::operator<<(this_02,member->name);
            pDVar3 = ast::operator<<(pDVar3,this_00);
            ast::operator<<(pDVar3,this_01);
            goto LAB_003365e9;
          }
        }
      }
    }
  }
  this_02 = addDiag(this,(DiagCode)0x2a000a,member->location);
  Diagnostic::operator<<(this_02,member->name);
LAB_003365e9:
  Diagnostic::addNote(this_02,(DiagCode)0xa0001,existing->location);
  return;
}

Assistant:

void Scope::reportNameConflict(const Symbol& member, const Symbol& existing) const {
    Diagnostic* diag;
    if (existing.isValue() && member.isValue()) {
        const Type& memberType = member.as<ValueSymbol>().getType();
        const Type& existingType = existing.as<ValueSymbol>().getType();

        if (memberType.isError() || existingType.isError() || memberType.isMatching(existingType)) {
            diag = &addDiag(diag::Redefinition, member.location);
            (*diag) << member.name;
        }
        else {
            diag = &addDiag(diag::RedefinitionDifferentType, member.location);
            (*diag) << member.name << memberType << existingType;
        }
    }
    else {
        diag = &addDiag(diag::Redefinition, member.location);
        (*diag) << member.name;
    }
    diag->addNote(diag::NotePreviousDefinition, existing.location);
}